

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          ExpressionSyntax *args_4,Token *args_5,StatementSyntax *args_6)

{
  Token openParen;
  Token closeParen;
  LoopStatementSyntax *attributes;
  Info *in_RCX;
  StatementSyntax *in_RDX;
  Token *in_R8;
  Info *in_R9;
  undefined8 *in_stack_00000008;
  ExpressionSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  attributes = (LoopStatementSyntax *)
               allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                        in_stack_ffffffffffffff78);
  openParen.info = in_R9;
  openParen._0_8_ = in_RCX->location;
  closeParen.info = in_RCX;
  closeParen._0_8_ = in_R8;
  slang::syntax::LoopStatementSyntax::LoopStatementSyntax
            ((LoopStatementSyntax *)in_stack_00000008[1],(NamedLabelSyntax *)*in_stack_00000008,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes,*in_R8,openParen,
             in_stack_00000010,closeParen,in_RDX);
  return attributes;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }